

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BlockSingleStructArrayCase::init
          (BlockSingleStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_> *this_00;
  ShaderInterface *this_01;
  deUint32 dVar1;
  StructType *this_02;
  UniformBlock *pUVar2;
  VarType VStack_98;
  Uniform local_80;
  VarType local_40;
  
  this_01 = &(this->super_UniformBlockCase).m_interface;
  this_02 = deqp::gls::ub::ShaderInterface::allocStruct(this_01,"S");
  deqp::gls::ub::VarType::VarType((VarType *)&local_80,TYPE_INT_VEC3,4);
  deqp::gls::ub::StructType::addMember(this_02,"a",(VarType *)&local_80,0xc00);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_80);
  deqp::gls::ub::VarType::VarType(&VStack_98,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::VarType::VarType((VarType *)&local_80,&VStack_98,4);
  deqp::gls::ub::StructType::addMember(this_02,"b",(VarType *)&local_80,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_80);
  deqp::gls::ub::VarType::~VarType(&VStack_98);
  deqp::gls::ub::VarType::VarType((VarType *)&local_80,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(this_02,"c",(VarType *)&local_80,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_80);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock(this_01,"Block");
  deqp::gls::ub::VarType::VarType(&VStack_98,TYPE_UINT,1);
  deqp::gls::ub::Uniform::Uniform(&local_80,"u",&VStack_98,0);
  this_00 = &pUVar2->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_80);
  deqp::gls::ub::Uniform::~Uniform(&local_80);
  deqp::gls::ub::VarType::~VarType(&VStack_98);
  deqp::gls::ub::VarType::VarType(&local_40,this_02);
  deqp::gls::ub::VarType::VarType(&VStack_98,&local_40,3);
  deqp::gls::ub::Uniform::Uniform(&local_80,"s",&VStack_98,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_80);
  deqp::gls::ub::Uniform::~Uniform(&local_80);
  deqp::gls::ub::VarType::~VarType(&VStack_98);
  deqp::gls::ub::VarType::~VarType(&local_40);
  deqp::gls::ub::VarType::VarType(&VStack_98,TYPE_FLOAT_VEC4,2);
  deqp::gls::ub::Uniform::Uniform(&local_80,"v",&VStack_98,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_80);
  deqp::gls::ub::Uniform::~Uniform(&local_80);
  deqp::gls::ub::VarType::~VarType(&VStack_98);
  dVar1 = this->m_layoutFlags;
  pUVar2->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&pUVar2->m_instanceName);
    dVar1 = this->m_numInstances;
    pUVar2->m_arraySize = dVar1;
  }
  return dVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH);
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_LOW)));
		block.addUniform(Uniform("s", VarType(VarType(&typeS), 3)));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_MEDIUM)));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}